

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O3

bool existsAsSpecified(QString *path,LocateOptions options)

{
  bool bVar1;
  long in_FS_OFFSET;
  QFileInfo QStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)options.super_QFlagsStorageHelper<QStandardPaths::LocateOption,_4>.
             super_QFlagsStorage<QStandardPaths::LocateOption>.i & 1) == 0) {
    QFileInfo::QFileInfo(&QStack_18,path);
    bVar1 = QFileInfo::isFile(&QStack_18);
    QFileInfo::~QFileInfo(&QStack_18);
  }
  else {
    QDir::QDir((QDir *)&QStack_18,path);
    bVar1 = QDir::exists((QDir *)&QStack_18);
    QDir::~QDir((QDir *)&QStack_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool existsAsSpecified(const QString &path, QStandardPaths::LocateOptions options)
{
    if (options & QStandardPaths::LocateDirectory)
        return QDir(path).exists();
    return QFileInfo(path).isFile();
}